

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O0

void masc::polygon::box2ply(obb *box,Polygon *poly)

{
  double dVar1;
  Polygon *pPVar2;
  double *pdVar3;
  Point local_58;
  Point local_48;
  Point local_38;
  Point local_28;
  Polygon *local_18;
  Polygon *poly_local;
  obb *box_local;
  
  local_18 = poly;
  poly_local = (Polygon *)box;
  pdVar3 = mathtool::Point<double,_2>::operator[](box->corners,0);
  dVar1 = *pdVar3;
  pdVar3 = mathtool::Point<double,_2>::operator[]((Point<double,_2> *)poly_local,1);
  svg::Point::Point(&local_28,dVar1,*pdVar3);
  svg::Polygon::operator<<(poly,&local_28);
  pPVar2 = local_18;
  pdVar3 = mathtool::Point<double,_2>::operator[]
                     ((Point<double,_2> *)&(poly_local->super_Shape).fill.color,0);
  dVar1 = *pdVar3;
  pdVar3 = mathtool::Point<double,_2>::operator[]
                     ((Point<double,_2> *)&(poly_local->super_Shape).fill.color,1);
  svg::Point::Point(&local_38,dVar1,*pdVar3);
  svg::Polygon::operator<<(pPVar2,&local_38);
  pPVar2 = local_18;
  pdVar3 = mathtool::Point<double,_2>::operator[]
                     ((Point<double,_2> *)&(poly_local->super_Shape).fill.color.green,0);
  dVar1 = *pdVar3;
  pdVar3 = mathtool::Point<double,_2>::operator[]
                     ((Point<double,_2> *)&(poly_local->super_Shape).fill.color.green,1);
  svg::Point::Point(&local_48,dVar1,*pdVar3);
  svg::Polygon::operator<<(pPVar2,&local_48);
  pPVar2 = local_18;
  pdVar3 = mathtool::Point<double,_2>::operator[]
                     ((Point<double,_2> *)&(poly_local->super_Shape).stroke.width,0);
  dVar1 = *pdVar3;
  pdVar3 = mathtool::Point<double,_2>::operator[]
                     ((Point<double,_2> *)&(poly_local->super_Shape).stroke.width,1);
  svg::Point::Point(&local_58,dVar1,*pdVar3);
  svg::Polygon::operator<<(pPVar2,&local_58);
  svg::Polygon::endBoundary(local_18);
  return;
}

Assistant:

void box2ply(const masc::polygon::obb& box, svg::Polygon& poly)
{
    poly << svg::Point(box.corners[0][0], box.corners[0][1]);
    poly << svg::Point(box.corners[1][0], box.corners[1][1]);
    poly << svg::Point(box.corners[2][0], box.corners[2][1]);
    poly << svg::Point(box.corners[3][0], box.corners[3][1]);
    poly.endBoundary();
}